

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_change_config(AV1_COMP *cpi,AV1EncoderConfig *oxcf,_Bool is_sb_size_changed)

{
  int iVar1;
  SequenceHeader *pSVar2;
  int16_t (*paiVar3) [8];
  InterpFilter IVar4;
  _Bool _Var5;
  int iVar6;
  FrameDimensionCfg *pFVar7;
  AV1LevelInfo *pAVar8;
  void *pvVar9;
  int8_t *piVar10;
  byte in_DL;
  void *in_RSI;
  AV1_COMP *in_RDI;
  LAYER_CONTEXT *lc;
  int layer;
  int sl;
  int mi_cols;
  int mi_rows;
  int last_height;
  int last_width;
  int i_2;
  int i_1;
  int i;
  int lap_lag_in_frames;
  FeatureFlags *features;
  RateControlCfg *rc_cfg;
  FrameDimensionCfg *frm_dim_cfg;
  RefreshFrameInfo *refresh_frame;
  AV1LevelParams *level_params;
  MACROBLOCK *x;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  CompoundTypeRdBuffers *in_stack_ffffffffffffff48;
  int num_planes;
  AV1_COMP *in_stack_ffffffffffffff50;
  AV1_COMP *pAVar11;
  AV1EncoderConfig *in_stack_ffffffffffffff58;
  size_t num;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  aom_superres_mode aVar12;
  size_t in_stack_ffffffffffffff68;
  LAYER_CONTEXT *pLVar13;
  int local_8c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  AV1LevelParams *pAVar14;
  PRIMARY_RATE_CONTROL *target_bandwidth;
  AV1_COMP *cpi_00;
  
  pSVar2 = (in_RDI->common).seq_params;
  cpi_00 = (AV1_COMP *)&in_RDI->rc;
  target_bandwidth = &in_RDI->ppi->p_rc;
  pAVar11 = (AV1_COMP *)&in_RDI->td;
  pAVar14 = &in_RDI->ppi->level_params;
  pFVar7 = &(in_RDI->oxcf).frm_dim_cfg;
  local_6c = -1;
  if ((in_RDI->ppi->lap_enabled != 0) && (in_RDI->compressor_stage == '\x01')) {
    local_6c = (in_RDI->oxcf).gf_cfg.lag_in_frames;
  }
  memcpy(&in_RDI->oxcf,in_RSI,0x480);
  av1_update_film_grain_parameters
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  if (*(int *)((long)in_RSI + 0xf8) == 4) {
    aVar12 = AOM_SUPERRES_NONE;
  }
  else {
    aVar12 = *(aom_superres_mode *)((long)in_RSI + 0xf8);
  }
  in_RDI->superres_mode = aVar12;
  *(aom_bit_depth_t *)(pAVar11->enc_quant_dequant_params).quants.y_zbin[0xb3] = pSVar2->bit_depth;
  *(WarpedMotionParams **)((pAVar11->enc_quant_dequant_params).quants.y_zbin[0xb8] + 4) =
       (in_RDI->common).global_motion;
  *(undefined8 *)pAVar14->target_seq_level_idx = *(undefined8 *)(in_RDI->oxcf).target_seq_level_idx;
  *(undefined8 *)(pAVar14->target_seq_level_idx + 8) =
       *(undefined8 *)((in_RDI->oxcf).target_seq_level_idx + 8);
  *(undefined8 *)(pAVar14->target_seq_level_idx + 0x10) =
       *(undefined8 *)((in_RDI->oxcf).target_seq_level_idx + 0x10);
  *(undefined8 *)(pAVar14->target_seq_level_idx + 0x18) =
       *(undefined8 *)((in_RDI->oxcf).target_seq_level_idx + 0x18);
  pAVar14->keep_level_stats = 0;
  for (local_70 = 0; local_70 < 0x20; local_70 = local_70 + 1) {
    if (((pAVar14->target_seq_level_idx[local_70] < 0x1c) ||
        (pAVar14->target_seq_level_idx[local_70] == ' ')) &&
       (pAVar14->keep_level_stats = 1 << ((byte)local_70 & 0x1f) | pAVar14->keep_level_stats,
       pAVar14->level_info[local_70] == (AV1LevelInfo *)0x0)) {
      pAVar8 = (AV1LevelInfo *)
               aom_calloc((size_t)in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
      pAVar14->level_info[local_70] = pAVar8;
      if (pAVar14->level_info[local_70] == (AV1LevelInfo *)0x0) {
        aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate level_params->level_info[i]");
      }
    }
  }
  if (pAVar14->target_seq_level_idx[0] < 0x1c) {
    config_target_level(pAVar11,(AV1_LEVEL)((ulong)pAVar14 >> 0x38),(int)pAVar14);
  }
  iVar6 = has_no_stats_stage(in_RDI);
  if ((iVar6 == 0) || (*(int *)((long)in_RSI + 0xbc) != 3)) {
    iVar6 = is_one_pass_rt_params(in_stack_ffffffffffffff50);
    if ((iVar6 == 0) || ((in_RDI->common).current_frame.frame_number == 0)) {
      target_bandwidth->baseline_gf_interval = 0x12;
    }
  }
  else {
    target_bandwidth->baseline_gf_interval = 0x10;
  }
  (in_RDI->refresh_frame).golden_frame = false;
  (in_RDI->refresh_frame).bwd_ref_frame = false;
  (in_RDI->common).features.refresh_frame_context = (*(byte *)((long)in_RSI + 0x123) & 1) == 0;
  if ((*(byte *)((long)in_RSI + 0x360) & 1) != 0) {
    (in_RDI->common).features.refresh_frame_context = '\0';
  }
  if (*(long *)(pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1b] == 0) {
    pvVar9 = aom_memalign(in_stack_ffffffffffffff68,CONCAT44(aVar12,in_stack_ffffffffffffff60));
    *(void **)(pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1b] = pvVar9;
    if (*(long *)(pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1b] == 0) {
      aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate x->palette_buffer");
    }
  }
  if (*(long *)(pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1e] == 0) {
    pvVar9 = aom_memalign(in_stack_ffffffffffffff68,CONCAT44(aVar12,in_stack_ffffffffffffff60));
    *(void **)(pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1e] = pvVar9;
    if (*(long *)(pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1e] == 0) {
      aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate x->tmp_conv_dst");
    }
    *(undefined8 *)((pAVar11->enc_quant_dequant_params).quants.y_round[0xc4] + 4) =
         *(undefined8 *)(pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1e];
  }
  if ((in_RDI->oxcf).kf_cfg.key_freq_max != 0) {
    if (*(long *)((pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1b] + 4) == 0) {
      alloc_compound_type_rd_buffers
                ((aom_internal_error_info *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
      if (*(long *)((pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1e] +
                   (long)local_74 * 4 + 4) == 0) {
        pvVar9 = aom_memalign(in_stack_ffffffffffffff68,CONCAT44(aVar12,in_stack_ffffffffffffff60));
        *(void **)((pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1e] +
                  (long)local_74 * 4 + 4) = pvVar9;
        if (*(long *)((pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1e] +
                     (long)local_74 * 4 + 4) == 0) {
          aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate x->tmp_pred_bufs[i]");
        }
        *(undefined8 *)
         ((pAVar11->enc_quant_dequant_params).quants.y_round[0xc5] + (long)local_74 * 4) =
             *(undefined8 *)
              ((pAVar11->enc_quant_dequant_params).quants.y_quant_fp[0x1e] + (long)local_74 * 4 + 4)
        ;
      }
    }
  }
  av1_reset_segment_features((AV1_COMMON *)in_stack_ffffffffffffff50);
  av1_set_high_precision_mv(in_RDI,1,0);
  if (target_bandwidth->bits_off_target < target_bandwidth->maximum_buffer_size) {
    num = target_bandwidth->bits_off_target;
  }
  else {
    num = target_bandwidth->maximum_buffer_size;
  }
  target_bandwidth->bits_off_target = num;
  if (target_bandwidth->buffer_level < target_bandwidth->maximum_buffer_size) {
    pAVar11 = (AV1_COMP *)target_bandwidth->buffer_level;
  }
  else {
    pAVar11 = (AV1_COMP *)target_bandwidth->maximum_buffer_size;
  }
  target_bandwidth->buffer_level = (int64_t)pAVar11;
  av1_new_framerate(pAVar11,(double)in_stack_ffffffffffffff48);
  *(int *)((long)(cpi_00->enc_quant_dequant_params).quants.y_quant[10] + 0xc) =
       *(int *)((long)in_RSI + 0xb0);
  *(int *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0xb] = *(int *)((long)in_RSI + 0xb4);
  iVar6 = is_lossless_requested(&(in_RDI->oxcf).rc_cfg);
  if (iVar6 != 0) {
    for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
      target_bandwidth->avg_frame_qindex[local_78] = 0;
    }
  }
  IVar4 = MULTITAP_SHARP2;
  if ((*(byte *)((long)in_RSI + 0x360) & 1) != 0) {
    IVar4 = EIGHTTAP_REGULAR;
  }
  (in_RDI->common).features.interp_filter = IVar4;
  _Var5 = is_switchable_motion_mode_allowed
                    ((_Bool)((in_RDI->common).features.allow_warped_motion & 1),
                     (_Bool)(*(byte *)((long)in_RSI + 0x3c6) & 1));
  (in_RDI->common).features.switchable_motion_mode = _Var5;
  if (((in_RDI->oxcf).frm_dim_cfg.render_width < 1) ||
     ((in_RDI->oxcf).frm_dim_cfg.render_height < 1)) {
    (in_RDI->common).render_width = pFVar7->width;
    (in_RDI->common).render_height = (in_RDI->oxcf).frm_dim_cfg.height;
  }
  else {
    (in_RDI->common).render_width = (in_RDI->oxcf).frm_dim_cfg.render_width;
    (in_RDI->common).render_height = (in_RDI->oxcf).frm_dim_cfg.render_height;
  }
  iVar6 = (in_RDI->common).width;
  iVar1 = (in_RDI->common).height;
  (in_RDI->common).width = pFVar7->width;
  (in_RDI->common).height = (in_RDI->oxcf).frm_dim_cfg.height;
  if (((in_RDI->data_alloc_width < (in_RDI->common).width) ||
      (in_RDI->data_alloc_height < (in_RDI->common).height)) || ((in_DL & 1) != 0)) {
    av1_free_context_buffers((AV1_COMMON *)0x231a1b);
    av1_free_shared_coeff_buffer((PC_TREE_SHARED_BUFFERS *)pAVar11);
    av1_free_sms_tree((ThreadData_conflict *)0x231a4a);
    num_planes = (int)((ulong)(in_RDI->td).firstpass_ctx >> 0x20);
    av1_num_planes(&in_RDI->common);
    av1_free_pmc((PICK_MODE_CONTEXT *)pAVar11,num_planes);
    (in_RDI->td).firstpass_ctx = (PICK_MODE_CONTEXT *)0x0;
    alloc_compressor_data(pAVar11);
    realloc_segmentation_maps(pAVar11);
    in_RDI->data_alloc_width = (in_RDI->common).width;
    in_RDI->data_alloc_height = (in_RDI->common).height;
    in_RDI->frame_size_related_setup_done = false;
  }
  av1_update_frame_size((AV1_COMP *)CONCAT44(aVar12,in_stack_ffffffffffffff60));
  if ((((in_RDI->common).width != iVar6) || ((in_RDI->common).height != iVar1)) &&
     ((in_RDI->oxcf).q_cfg.aq_mode == '\x03')) {
    aom_free(pAVar11);
    piVar10 = (int8_t *)aom_calloc(num,(size_t)pAVar11);
    in_RDI->cyclic_refresh->map = piVar10;
    if (in_RDI->cyclic_refresh->map == (int8_t *)0x0) {
      aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->cyclic_refresh->map");
    }
    if (1 < (in_RDI->svc).number_spatial_layers) {
      for (local_8c = 0; local_8c < (in_RDI->svc).number_spatial_layers; local_8c = local_8c + 1) {
        pLVar13 = (in_RDI->svc).layer_context + local_8c * (in_RDI->svc).number_temporal_layers;
        pLVar13->sb_index = 0;
        pLVar13->actual_num_seg1_blocks = 0;
        pLVar13->actual_num_seg2_blocks = 0;
        pLVar13->counter_encode_maxq_scene_change = 0;
        aom_free(pAVar11);
        piVar10 = (int8_t *)aom_calloc(num,(size_t)pAVar11);
        pLVar13->map = piVar10;
        if (pLVar13->map == (int8_t *)0x0) {
          aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate lc->map"
                            );
        }
      }
    }
  }
  paiVar3 = (cpi_00->enc_quant_dequant_params).quants.y_quant;
  *(int16_t *)((long)(paiVar3 + 2) + 8) = 0;
  *(int16_t *)((long)(paiVar3 + 2) + 10) = 0;
  if ((in_RDI->ppi->rtc_ref).set_ref_frame_config == 0) {
    (in_RDI->ext_flags).refresh_frame.update_pending = false;
  }
  (in_RDI->ext_flags).refresh_frame_context_pending = false;
  if (in_RDI->ppi->use_svc != 0) {
    av1_update_layer_context_change_config(cpi_00,(int64_t)target_bandwidth);
  }
  check_reset_rc_flag(pAVar11);
  if (local_6c != -1) {
    (in_RDI->oxcf).gf_cfg.lag_in_frames = local_6c;
  }
  in_RDI->alloc_pyramid = (_Bool)(*(byte *)((long)in_RSI + 299) & 1);
  return;
}

Assistant:

void av1_change_config(struct AV1_COMP *cpi, const AV1EncoderConfig *oxcf,
                       bool is_sb_size_changed) {
  AV1_COMMON *const cm = &cpi->common;
  SequenceHeader *const seq_params = cm->seq_params;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  MACROBLOCK *const x = &cpi->td.mb;
  AV1LevelParams *const level_params = &cpi->ppi->level_params;
  RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  const FrameDimensionCfg *const frm_dim_cfg = &cpi->oxcf.frm_dim_cfg;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  FeatureFlags *const features = &cm->features;

  // in case of LAP, lag in frames is set according to number of lap buffers
  // calculated at init time. This stores and restores LAP's lag in frames to
  // prevent override by new cfg.
  int lap_lag_in_frames = -1;
  if (cpi->ppi->lap_enabled && cpi->compressor_stage == LAP_STAGE) {
    lap_lag_in_frames = cpi->oxcf.gf_cfg.lag_in_frames;
  }

  cpi->oxcf = *oxcf;

#if !CONFIG_REALTIME_ONLY
  av1_update_film_grain_parameters(cpi, oxcf);
#endif

  // When user provides superres_mode = AOM_SUPERRES_AUTO, we still initialize
  // superres mode for current encoding = AOM_SUPERRES_NONE. This is to ensure
  // that any analysis (e.g. TPL) happening outside the main encoding loop still
  // happens at full resolution.
  // This value will later be set appropriately just before main encoding loop.
  cpi->superres_mode = oxcf->superres_cfg.superres_mode == AOM_SUPERRES_AUTO
                           ? AOM_SUPERRES_NONE
                           : oxcf->superres_cfg.superres_mode;  // default
  x->e_mbd.bd = (int)seq_params->bit_depth;
  x->e_mbd.global_motion = cm->global_motion;

  memcpy(level_params->target_seq_level_idx, cpi->oxcf.target_seq_level_idx,
         sizeof(level_params->target_seq_level_idx));
  level_params->keep_level_stats = 0;
  for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i) {
    if (level_params->target_seq_level_idx[i] < SEQ_LEVELS ||
        level_params->target_seq_level_idx[i] == SEQ_LEVEL_KEEP_STATS) {
      level_params->keep_level_stats |= 1u << i;
      if (!level_params->level_info[i]) {
        CHECK_MEM_ERROR(cm, level_params->level_info[i],
                        aom_calloc(1, sizeof(*level_params->level_info[i])));
      }
    }
  }

  // TODO(huisu@): level targeting currently only works for the 0th operating
  // point, so scalable coding is not supported yet.
  if (level_params->target_seq_level_idx[0] < SEQ_LEVELS) {
    // Adjust encoder config in order to meet target level.
    config_target_level(cpi, level_params->target_seq_level_idx[0],
                        seq_params->tier[0]);
  }

  if (has_no_stats_stage(cpi) && (rc_cfg->mode == AOM_Q)) {
    p_rc->baseline_gf_interval = FIXED_GF_INTERVAL;
  } else if (!is_one_pass_rt_params(cpi) ||
             cm->current_frame.frame_number == 0) {
    // For rtc mode: logic for setting the baseline_gf_interval is done
    // in av1_get_one_pass_rt_params(), and it should not be reset here in
    // change_config(), unless after init_config (first frame).
    p_rc->baseline_gf_interval = (MIN_GF_INTERVAL + MAX_GF_INTERVAL) / 2;
  }

  refresh_frame->golden_frame = false;
  refresh_frame->bwd_ref_frame = false;

  features->refresh_frame_context =
      (oxcf->tool_cfg.frame_parallel_decoding_mode)
          ? REFRESH_FRAME_CONTEXT_DISABLED
          : REFRESH_FRAME_CONTEXT_BACKWARD;
  if (oxcf->tile_cfg.enable_large_scale_tile)
    features->refresh_frame_context = REFRESH_FRAME_CONTEXT_DISABLED;

  if (x->palette_buffer == NULL) {
    CHECK_MEM_ERROR(cm, x->palette_buffer,
                    aom_memalign(16, sizeof(*x->palette_buffer)));
  }

  if (x->tmp_conv_dst == NULL) {
    CHECK_MEM_ERROR(
        cm, x->tmp_conv_dst,
        aom_memalign(32, MAX_SB_SIZE * MAX_SB_SIZE * sizeof(*x->tmp_conv_dst)));
    x->e_mbd.tmp_conv_dst = x->tmp_conv_dst;
  }
  // The buffers 'tmp_pred_bufs[]' and 'comp_rd_buffer' are used in inter frames
  // to store intermediate inter mode prediction results and are not required
  // for allintra encoding mode. Hence, the memory allocations for these buffers
  // are avoided for allintra encoding mode.
  if (cpi->oxcf.kf_cfg.key_freq_max != 0) {
    if (x->comp_rd_buffer.pred0 == NULL)
      alloc_compound_type_rd_buffers(cm->error, &x->comp_rd_buffer);

    for (int i = 0; i < 2; ++i) {
      if (x->tmp_pred_bufs[i] == NULL) {
        CHECK_MEM_ERROR(cm, x->tmp_pred_bufs[i],
                        aom_memalign(32, 2 * MAX_MB_PLANE * MAX_SB_SQUARE *
                                             sizeof(*x->tmp_pred_bufs[i])));
        x->e_mbd.tmp_obmc_bufs[i] = x->tmp_pred_bufs[i];
      }
    }
  }

  av1_reset_segment_features(cm);

  av1_set_high_precision_mv(cpi, 1, 0);

  // Under a configuration change, where maximum_buffer_size may change,
  // keep buffer level clipped to the maximum allowed buffer size.
  p_rc->bits_off_target =
      AOMMIN(p_rc->bits_off_target, p_rc->maximum_buffer_size);
  p_rc->buffer_level = AOMMIN(p_rc->buffer_level, p_rc->maximum_buffer_size);

  // Set up frame rate and related parameters rate control values.
  av1_new_framerate(cpi, cpi->framerate);

  // Set absolute upper and lower quality limits
  rc->worst_quality = rc_cfg->worst_allowed_q;
  rc->best_quality = rc_cfg->best_allowed_q;

  // If lossless has been requested make sure average Q accumulators are reset.
  if (is_lossless_requested(&cpi->oxcf.rc_cfg)) {
    int i;
    for (i = 0; i < FRAME_TYPES; ++i) {
      p_rc->avg_frame_qindex[i] = 0;
    }
  }

  features->interp_filter =
      oxcf->tile_cfg.enable_large_scale_tile ? EIGHTTAP_REGULAR : SWITCHABLE;
  features->switchable_motion_mode = is_switchable_motion_mode_allowed(
      features->allow_warped_motion, oxcf->motion_mode_cfg.enable_obmc);

  if (frm_dim_cfg->render_width > 0 && frm_dim_cfg->render_height > 0) {
    cm->render_width = frm_dim_cfg->render_width;
    cm->render_height = frm_dim_cfg->render_height;
  } else {
    cm->render_width = frm_dim_cfg->width;
    cm->render_height = frm_dim_cfg->height;
  }

  int last_width = cm->width;
  int last_height = cm->height;
  cm->width = frm_dim_cfg->width;
  cm->height = frm_dim_cfg->height;

  if (cm->width > cpi->data_alloc_width ||
      cm->height > cpi->data_alloc_height || is_sb_size_changed) {
    av1_free_context_buffers(cm);
    av1_free_shared_coeff_buffer(&cpi->td.shared_coeff_buf);
    av1_free_sms_tree(&cpi->td);
    av1_free_pmc(cpi->td.firstpass_ctx, av1_num_planes(cm));
    cpi->td.firstpass_ctx = NULL;
    alloc_compressor_data(cpi);
    realloc_segmentation_maps(cpi);
    cpi->data_alloc_width = cm->width;
    cpi->data_alloc_height = cm->height;
    cpi->frame_size_related_setup_done = false;
  }
  av1_update_frame_size(cpi);

  if (cm->width != last_width || cm->height != last_height) {
    if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ) {
      int mi_rows = cpi->common.mi_params.mi_rows;
      int mi_cols = cpi->common.mi_params.mi_cols;
      aom_free(cpi->cyclic_refresh->map);
      CHECK_MEM_ERROR(
          cm, cpi->cyclic_refresh->map,
          aom_calloc(mi_rows * mi_cols, sizeof(*cpi->cyclic_refresh->map)));
      if (cpi->svc.number_spatial_layers > 1) {
        for (int sl = 0; sl < cpi->svc.number_spatial_layers; ++sl) {
          const int layer =
              LAYER_IDS_TO_IDX(sl, 0, cpi->svc.number_temporal_layers);
          LAYER_CONTEXT *const lc = &cpi->svc.layer_context[layer];
          lc->sb_index = 0;
          lc->actual_num_seg1_blocks = 0;
          lc->actual_num_seg2_blocks = 0;
          lc->counter_encode_maxq_scene_change = 0;
          aom_free(lc->map);
          CHECK_MEM_ERROR(cm, lc->map,
                          aom_calloc(mi_rows * mi_cols, sizeof(*lc->map)));
        }
      }
    }
  }

  rc->is_src_frame_alt_ref = 0;

  if (!cpi->ppi->rtc_ref.set_ref_frame_config)
    cpi->ext_flags.refresh_frame.update_pending = 0;
  cpi->ext_flags.refresh_frame_context_pending = 0;

  if (cpi->ppi->use_svc)
    av1_update_layer_context_change_config(cpi, rc_cfg->target_bandwidth);

  check_reset_rc_flag(cpi);

  // restore the value of lag_in_frame for LAP stage.
  if (lap_lag_in_frames != -1) {
    cpi->oxcf.gf_cfg.lag_in_frames = lap_lag_in_frames;
  }

#if CONFIG_REALTIME_ONLY
  assert(!oxcf->tool_cfg.enable_global_motion);
  cpi->alloc_pyramid = false;
#else
  cpi->alloc_pyramid = oxcf->tool_cfg.enable_global_motion;
#endif  // CONFIG_REALTIME_ONLY
}